

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

TypedAttribute<std::vector<float,_std::allocator<float>_>_> *
Imf_2_5::TypedAttribute<std::vector<float,_std::allocator<float>_>_>::cast(Attribute *attribute)

{
  TypedAttribute<std::vector<float,_std::allocator<float>_>_> *pTVar1;
  TypeExc *this;
  
  if (attribute == (Attribute *)0x0) {
    pTVar1 = (TypedAttribute<std::vector<float,_std::allocator<float>_>_> *)0x0;
  }
  else {
    pTVar1 = (TypedAttribute<std::vector<float,_std::allocator<float>_>_> *)
             __dynamic_cast(attribute,&Attribute::typeinfo,
                            &TypedAttribute<std::vector<float,std::allocator<float>>>::typeinfo,0);
  }
  if (pTVar1 != (TypedAttribute<std::vector<float,_std::allocator<float>_>_> *)0x0) {
    return pTVar1;
  }
  this = (TypeExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::TypeExc::TypeExc(this,"Unexpected attribute type.");
  __cxa_throw(this,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

const TypedAttribute<T> *
TypedAttribute<T>::cast (const Attribute *attribute)
{
    const TypedAttribute<T> *t =
	dynamic_cast <const TypedAttribute<T> *> (attribute);

    if (t == 0)
	throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}